

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O1

char * inputSeq(void)

{
  undefined8 uVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  char *__dest;
  long lVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  undefined8 uStack_360;
  char local_358 [8];
  char buffer [256];
  long local_250;
  ifstream inFile;
  byte abStack_230 [488];
  char *local_48;
  ulong local_40;
  uint local_34;
  
  uStack_360 = 0x1027d8;
  std::ifstream::ifstream(&local_250);
  uStack_360 = 0x1027ee;
  pcVar3 = catStrStr(inputAddress,"seq.txt");
  uStack_360 = 0x102800;
  openFile(pcVar3,(ifstream *)&local_250);
  uVar8 = 0;
  if ((abStack_230[*(long *)(local_250 + -0x18)] & 2) == 0) {
    lVar6 = (long)&local_250 + *(long *)(local_250 + -0x18);
    uVar8 = 0;
    do {
      uStack_360 = 0x10283e;
      std::ios::widen((char)lVar6);
      uStack_360 = 0x102851;
      std::istream::getline((char *)&local_250,(long)local_358,'\0');
      uVar8 = (ulong)((int)uVar8 + 1);
      lVar6 = (long)&local_250 + *(long *)(local_250 + -0x18);
    } while ((abStack_230[*(long *)(local_250 + -0x18)] & 2) == 0);
  }
  uStack_360 = 0x10287c;
  std::ifstream::close();
  uStack_360 = 0x10288e;
  openFile(pcVar3,(ifstream *)&local_250);
  iVar2 = (int)uVar8;
  uVar4 = (ulong)(iVar2 - 1);
  pcVar3 = local_358 + uVar4 * -0x100;
  uVar1 = *(undefined8 *)(local_250 + -0x18);
  (&uStack_360)[uVar4 * -0x20] = 0x1028bd;
  std::ios::widen((char)(ifstream *)&local_250 + (char)uVar1);
  (&uStack_360)[uVar4 * -0x20] = 0x1028d8;
  std::istream::getline((char *)&local_250,(long)local_358,'\0');
  local_34 = iVar2 - 2;
  iVar7 = 0;
  local_48 = local_358;
  local_40 = uVar8;
  if (2 < iVar2) {
    uVar8 = (ulong)local_34;
    iVar7 = 0;
    pcVar9 = pcVar3;
    local_48 = local_358;
    do {
      uVar1 = *(undefined8 *)(local_250 + -0x18);
      (&uStack_360)[uVar4 * -0x20] = 0x10291a;
      std::ios::widen((char)uVar1 + (char)&local_250);
      (&uStack_360)[uVar4 * -0x20] = 0x10292d;
      std::istream::getline((char *)&local_250,(long)pcVar9,'\0');
      (&uStack_360)[uVar4 * -0x20] = 0x102935;
      sVar5 = strlen(pcVar9);
      iVar7 = iVar7 + (int)sVar5;
      pcVar9 = pcVar9 + 0x100;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  iVar2 = -1;
  if (-1 < iVar7) {
    iVar2 = iVar7;
  }
  (&uStack_360)[uVar4 * -0x20] = 0x102958;
  __dest = (char *)operator_new__((long)iVar2);
  pcVar9 = local_48;
  *__dest = '\0';
  if (2 < (int)local_40) {
    uVar8 = (ulong)local_34;
    do {
      (&uStack_360)[uVar4 * -0x20] = 0x10297b;
      strcat(__dest,pcVar3);
      pcVar3 = pcVar3 + 0x100;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  (&uStack_360)[uVar4 * -0x20] = 0x102993;
  std::ifstream::close();
  pcVar9[-8] = -0x5e;
  pcVar9[-7] = ')';
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  std::ifstream::~ifstream(&local_250);
  return __dest;
}

Assistant:

char * inputSeq(){
    // read in the sequence
    char *seq;
    char buffer[256];
    char *filename;
    ifstream inFile;
    filename = catStrStr(inputAddress,"seq.txt");
    openFile(filename, inFile);
    int cntLines = 0;
    while (! inFile.eof()) { inFile.getline(buffer, 256); cntLines++; }
    cntLines--;
    inFile.close();

    openFile(filename, inFile);
    char tmp[cntLines][256];
    int len=0;
    inFile.getline(buffer, 256);                    //  the first line is not needed
    for (int i=0; i<cntLines-1; i++) {
        inFile.getline(tmp[i], 256);
        len += strlen(tmp[i]);
    }

    seq = new char [len];
    strcpy(seq, "");
    for (int i=0; i<cntLines-1; i++)  strcat(seq, tmp[i]);
    inFile.close();
    return seq;

}